

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O0

ssize_t __thiscall LASindex::write(LASindex *this,int __fd,void *__buf,size_t __n)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  FILE *__stream;
  LASindex *extraout_RAX;
  ulong uVar4;
  LASindex *extraout_RAX_00;
  LASindex *extraout_RAX_01;
  void *__buf_00;
  undefined4 in_register_00000034;
  FILE *file;
  char *name;
  char *file_name_local;
  LASindex *this_local;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  if (pcVar3 == (char *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    __s = strdup(pcVar3);
    pcVar1 = strstr(pcVar3,".las");
    if ((pcVar1 == (char *)0x0) && (pcVar1 = strstr(pcVar3,".laz"), pcVar1 == (char *)0x0)) {
      pcVar1 = strstr(pcVar3,".LAS");
      if ((pcVar1 == (char *)0x0) && (pcVar3 = strstr(pcVar3,".LAZ"), pcVar3 == (char *)0x0)) {
        sVar2 = strlen(__s);
        __s[sVar2 - 3] = 'l';
        sVar2 = strlen(__s);
        __s[sVar2 - 2] = 'a';
        sVar2 = strlen(__s);
        sVar2 = sVar2 - 1;
        __s[sVar2] = 'x';
      }
      else {
        sVar2 = strlen(__s);
        sVar2 = sVar2 - 1;
        __s[sVar2] = 'X';
      }
    }
    else {
      sVar2 = strlen(__s);
      sVar2 = sVar2 - 1;
      __s[sVar2] = 'x';
    }
    __stream = (FILE *)LASfopen(__s,"wb");
    if (__stream == (FILE *)0x0) {
      laserror<char*>("(LASindex): cannot open file \'%s\' for write",__s);
      free(__s);
      this_local._7_1_ = 0;
      this = extraout_RAX;
    }
    else {
      uVar4 = write(this,(int)__stream,__buf_00,sVar2);
      if ((uVar4 & 1) == 0) {
        laserror<char*>("(LASindex): cannot write file \'%s\'",__s);
        fclose(__stream);
        free(__s);
        this_local._7_1_ = 0;
        this = extraout_RAX_00;
      }
      else {
        fclose(__stream);
        free(__s);
        this_local._7_1_ = 1;
        this = extraout_RAX_01;
      }
    }
  }
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

BOOL LASindex::write(const char* file_name) const
{
  if (file_name == 0) return FALSE;
  char* name = LASCopyString(file_name);
  if (strstr(file_name, ".las") || strstr(file_name, ".laz"))
  {
    name[strlen(name)-1] = 'x';
  }
  else if (strstr(file_name, ".LAS") || strstr(file_name, ".LAZ"))
  {
    name[strlen(name)-1] = 'X';
  }
  else
  {
    name[strlen(name)-3] = 'l';
    name[strlen(name)-2] = 'a';
    name[strlen(name)-1] = 'x';
  }
  FILE* file = LASfopen(name, "wb");

  if (file == 0)
  {
    laserror("(LASindex): cannot open file '%s' for write", name);
    free(name);
    return FALSE;
  }
  if (!write(file))
  {
    laserror("(LASindex): cannot write file '%s'", name);
    fclose(file);
    free(name);
    return FALSE;
  }
  fclose(file);
  free(name);
  return TRUE;
}